

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos bcemit_INS(FuncState *fs,BCIns ins)

{
  FuncState *fs_00;
  void *pvVar1;
  undefined4 in_ESI;
  long in_RDI;
  ptrdiff_t base;
  LexState *ls;
  BCPos pc;
  MSize in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  void *p;
  uint uVar2;
  
  uVar2 = *(uint *)(in_RDI + 0x28);
  p = *(void **)(in_RDI + 8);
  jmp_patchval((FuncState *)CONCAT44(in_ESI,uVar2),(BCPos)((ulong)p >> 0x20),(BCPos)p,
               (BCReg)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(BCPos)in_stack_ffffffffffffffe0);
  *(undefined4 *)(in_RDI + 0x30) = 0xffffffff;
  if (*(uint *)(in_RDI + 0x50) <= uVar2) {
    fs_00 = (FuncState *)(*(long *)(in_RDI + 0x48) - *(long *)((long)p + 0x90) >> 3);
    if (0x3ffffff < *(uint *)((long)p + 0x98)) {
      err_limit(fs_00,in_stack_ffffffffffffffdc,(char *)0x14ef5f);
    }
    pvVar1 = lj_mem_grow((lua_State *)CONCAT44(in_ESI,uVar2),p,(MSize *)fs_00,
                         in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    *(void **)((long)p + 0x90) = pvVar1;
    *(int *)(in_RDI + 0x50) = *(int *)((long)p + 0x98) - (int)fs_00;
    *(long *)(in_RDI + 0x48) = *(long *)((long)p + 0x90) + (long)fs_00 * 8;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + (ulong)uVar2 * 8) = in_ESI;
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + 4 + (ulong)uVar2 * 8) = *(undefined4 *)((long)p + 100);
  *(uint *)(in_RDI + 0x28) = uVar2 + 1;
  return uVar2;
}

Assistant:

static BCPos bcemit_INS(FuncState *fs, BCIns ins)
{
  BCPos pc = fs->pc;
  LexState *ls = fs->ls;
  jmp_patchval(fs, fs->jpc, pc, NO_REG, pc);
  fs->jpc = NO_JMP;
  if (LJ_UNLIKELY(pc >= fs->bclim)) {
    ptrdiff_t base = fs->bcbase - ls->bcstack;
    checklimit(fs, ls->sizebcstack, LJ_MAX_BCINS, "bytecode instructions");
    lj_mem_growvec(fs->L, ls->bcstack, ls->sizebcstack, LJ_MAX_BCINS,BCInsLine);
    fs->bclim = (BCPos)(ls->sizebcstack - base);
    fs->bcbase = ls->bcstack + base;
  }
  fs->bcbase[pc].ins = ins;
  fs->bcbase[pc].line = ls->lastline;
  fs->pc = pc+1;
  return pc;
}